

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_label.cc
# Opt level: O0

void output_and_account_example(vw *all,example *ec)

{
  size_t sVar1;
  int *piVar2;
  long in_RSI;
  long *in_RDI;
  int f;
  size_t i;
  label_data ld;
  example *ec_00;
  vw *all_00;
  ulong local_48;
  float local_1c;
  
  local_1c = (float)*(undefined8 *)(in_RSI + 0x6828);
  shared_data::update((shared_data *)*in_RDI,(bool)(*(byte *)(in_RSI + 0x68c8) & 1),
                      local_1c != 3.4028235e+38,*(float *)(in_RSI + 0x68b0),
                      *(float *)(in_RSI + 0x6870),*(size_t *)(in_RSI + 0x68a0));
  if (((local_1c != 3.4028235e+38) || (NAN(local_1c))) && ((*(byte *)(in_RSI + 0x68c8) & 1) == 0)) {
    *(double *)(*in_RDI + 0x38) =
         (double)local_1c * (double)*(float *)(in_RSI + 0x6870) + *(double *)(*in_RDI + 0x38);
  }
  ec_00 = *(example **)(in_RSI + 0x6878);
  all_00 = *(vw **)(in_RSI + 0x6880);
  (*(code *)in_RDI[0x6a7])(*(undefined4 *)(in_RSI + 0x68a8),0xbf800000,(int)in_RDI[0x6a6]);
  for (local_48 = 0; sVar1 = v_array<int>::size((v_array<int> *)(in_RDI + 0x6a2)), local_48 < sVar1;
      local_48 = local_48 + 1) {
    piVar2 = v_array<int>::operator[]((v_array<int> *)(in_RDI + 0x6a2),local_48);
    ec_00 = *(example **)(in_RSI + 0x6878);
    all_00 = *(vw **)(in_RSI + 0x6880);
    (*(code *)in_RDI[0x6a7])(*(undefined4 *)(in_RSI + 0x6850),0,*piVar2);
  }
  print_update(all_00,ec_00);
  return;
}

Assistant:

void output_and_account_example(vw& all, example& ec)
{
  label_data ld = ec.l.simple;

  all.sd->update(ec.test_only, ld.label != FLT_MAX, ec.loss, ec.weight, ec.num_features);
  if (ld.label != FLT_MAX && !ec.test_only)
    all.sd->weighted_labels += ((double)ld.label) * ec.weight;

  all.print(all.raw_prediction, ec.partial_prediction, -1, ec.tag);
  for (size_t i = 0; i < all.final_prediction_sink.size(); i++)
  {
    int f = (int)all.final_prediction_sink[i];
    all.print(f, ec.pred.scalar, 0, ec.tag);
  }

  print_update(all, ec);
}